

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O3

void testMultiPartFileMixingBasic(string *tempDir)

{
  int iVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing the mixed (ScanLine, Tiled, DeepScanLine and DeepTiled) multi-part file",0x4f)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  random_reseed(1);
  IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::numThreads();
  iVar1 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_2052c5::testWriteRead(1,1,0x32,tempDir);
  anon_unknown.dwarf_2052c5::testWriteRead(2,2,100,tempDir);
  anon_unknown.dwarf_2052c5::testWriteRead(5,3,0xfa,tempDir);
  anon_unknown.dwarf_2052c5::testWriteRead(0x32,4,0x9c4,tempDir);
  iVar1 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  return;
}

Assistant:

void
testMultiPartFileMixingBasic (const std::string& tempDir)
{
    try
    {
        cout
            << "Testing the mixed (ScanLine, Tiled, DeepScanLine and DeepTiled)"
               " multi-part file"
            << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (4);

        testWriteRead (1, 1, 50, tempDir);
        testWriteRead (2, 2, 100, tempDir);
        testWriteRead (5, 3, 250, tempDir);
        testWriteRead (50, 4, 2500, tempDir);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}